

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

int __thiscall HFSubConsumer::handle_enqueue(HFSubConsumer *this,zframe_t *frame)

{
  consumer_queue_filter p_Var1;
  __int_type _Var2;
  __int_type _Var3;
  ConcurrentQueueProducerTypelessBase *pCVar4;
  bool bVar5;
  byte *pbVar6;
  size_t sVar7;
  ulong uVar8;
  __pointer_type pPVar9;
  long lVar10;
  long lVar11;
  zframe_t *tmp;
  zframe_t *local_30;
  _zframe_t *local_28;
  
  p_Var1 = this->queuefilter;
  local_30 = frame;
  pbVar6 = zframe_data(frame);
  sVar7 = zframe_size(frame);
  bVar5 = (*p_Var1)(pbVar6,sVar7,this);
  if (bVar5) {
    pPVar9 = (this->framequeue).producerListTail._M_b._M_p;
    if (pPVar9 == (__pointer_type)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        _Var2 = (pPVar9->tailIndex).super___atomic_base<unsigned_long>._M_i;
        _Var3 = (pPVar9->headIndex).super___atomic_base<unsigned_long>._M_i;
        lVar10 = _Var2 - _Var3;
        if (_Var3 - _Var2 < 0x8000000000000001) {
          lVar10 = 0;
        }
        uVar8 = uVar8 + lVar10;
        pCVar4 = (pPVar9->super_ConcurrentQueueProducerTypelessBase).next;
        pPVar9 = (__pointer_type)&pCVar4[-1].token;
      } while (pCVar4 != (ConcurrentQueueProducerTypelessBase *)0x0);
    }
    if ((this->buffersize - 1 <= uVar8) &&
       (bVar5 = moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
                          ((ConcurrentQueue<_zframe_t*,MyTraits> *)&this->framequeue,
                           &this->replacetoken,&local_28), bVar5)) {
      zframe_destroy(&local_28);
    }
    moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::ExplicitProducer::
    enqueue<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::AllocationMode)0,_zframe_t*const&>
              ((ExplicitProducer *)&(this->ptoken).producer[-1].token,&local_30);
    if (this->waiting == true) {
      pPVar9 = (this->framequeue).producerListTail._M_b._M_p;
      if (pPVar9 == (__pointer_type)0x0) {
        lVar10 = 0;
      }
      else {
        lVar10 = 0;
        do {
          _Var2 = (pPVar9->tailIndex).super___atomic_base<unsigned_long>._M_i;
          _Var3 = (pPVar9->headIndex).super___atomic_base<unsigned_long>._M_i;
          lVar11 = _Var2 - _Var3;
          if (_Var3 - _Var2 < 0x8000000000000001) {
            lVar11 = 0;
          }
          lVar10 = lVar10 + lVar11;
          pCVar4 = (pPVar9->super_ConcurrentQueueProducerTypelessBase).next;
          pPVar9 = (__pointer_type)&pCVar4[-1].token;
        } while (pCVar4 != (ConcurrentQueueProducerTypelessBase *)0x0);
      }
      zsock_bsend(this->rep,"8",lVar10,0);
      this->waiting = false;
    }
  }
  else {
    zframe_destroy(&local_30);
  }
  return 0;
}

Assistant:

int HFSubConsumer::handle_enqueue(zframe_t *frame){
    //Only add to queue if it passes queuefilter
    if(!queuefilter(zframe_data(frame), zframe_size(frame), this)){
        zframe_destroy(&frame);
        return 0;
    }
    //Pseudo ring buffer, pops oldest so that ConcurrentQueue doesn't allocate new block and acts like concurrent ringbuffer
    if(framequeue.size_approx() >= buffersize-1){
        //Do this first before replacing with new frame
        zframe_t* tmp;
        if(framequeue.try_dequeue(replacetoken, tmp)){
            zframe_destroy(&tmp);
        }
    }
    framequeue.enqueue(ptoken, frame);

    if(waiting){
        zsock_bsend(rep, "8", static_cast<uint64_t>(framequeue.size_approx()), NULL);
        waiting = false;
    }
    return 0;
}